

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotp.c
# Opt level: O1

char * mtotp_hotp_l(char *secret,size_t secret_len,uint64_t counter,int length,char *buf)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint8_t hmac [20];
  byte abStack_38 [19];
  byte local_25;
  ulong local_20;
  
  local_20 = counter;
  if (secret_len == 0) {
    __assert_fail("secret_len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                  ,0x22,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
  }
  if (5 < length) {
    local_20 = counter >> 0x38 | (counter & 0xff000000000000) >> 0x28 |
               (counter & 0xff0000000000) >> 0x18 | (counter & 0xff00000000) >> 8 |
               (counter & 0xff000000) << 8 | (counter & 0xff0000) << 0x18 |
               (counter & 0xff00) << 0x28 | counter << 0x38;
    hmac_sha1((uint8_t *)secret,secret_len,(uint8_t *)&local_20,8,abStack_38);
    uVar2 = (ulong)(local_25 & 0xf);
    uVar1 = 1;
    iVar3 = length;
    do {
      uVar1 = uVar1 * 10;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    pad_otp(((uint)abStack_38[uVar2 + 2] << 8 |
             (uint)abStack_38[uVar2 + 1] << 0x10 | (abStack_38[uVar2] & 0x7f) << 0x18 |
            (uint)abStack_38[uVar2 + 3]) % uVar1,length,buf);
    return buf;
  }
  __assert_fail("length >= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                ,0x23,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
}

Assistant:

char *mtotp_hotp_l(const char *secret, size_t secret_len, uint64_t counter,
                   int length, char *buf) {
  assert(secret_len > 0);
  assert(length >= 6);

  counter = htobe64(counter);
  uint8_t hmac[20];
  hmac_sha1((const uint8_t *)secret, secret_len, (const uint8_t *)&counter,
            sizeof(counter), hmac);

  uint32_t code = mod(dynamic_truncate(hmac), length);

  pad_otp(code, length, buf);

  return buf;
}